

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resupply_Offer_PDU.cpp
# Opt level: O1

KString * __thiscall
KDIS::PDU::Resupply_Offer_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Resupply_Offer_PDU *this)

{
  pointer pSVar1;
  KString *pKVar2;
  ostream *poVar3;
  KCHAR8 in_CL;
  KUINT16 Tabs;
  KUINT16 Tabs_00;
  pointer this_00;
  KFLOAT32 KVar4;
  KStringStream ss;
  KString local_220;
  KString local_200;
  KString *local_1e0;
  KString local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  Header7::GetAsString_abi_cxx11_(&local_220,(Header7 *)this);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_220._M_dataplus._M_p,local_220._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"-Resupply Offer-\n",0x11);
  Logistics_Header::GetAsString_abi_cxx11_(&local_1d8,(Logistics_Header *)this);
  UTILS::IndentString(&local_200,&local_1d8,Tabs,in_CL);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_200._M_dataplus._M_p,local_200._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\tNumber Of Supply Types: ",0x19);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  local_1e0 = __return_storage_ptr__;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  this_00 = (this->super_Resupply_Received_PDU).m_vSupplies.
            super__Vector_base<KDIS::DATA_TYPE::Supplies,_std::allocator<KDIS::DATA_TYPE::Supplies>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (this->super_Resupply_Received_PDU).m_vSupplies.
           super__Vector_base<KDIS::DATA_TYPE::Supplies,_std::allocator<KDIS::DATA_TYPE::Supplies>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (this_00 != pSVar1) {
    do {
      (*(this_00->super_EntityType).super_DataTypeBase._vptr_DataTypeBase[2])(&local_200,this_00);
      UTILS::IndentString(&local_220,&local_200,Tabs_00,in_CL);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,local_220._M_dataplus._M_p,local_220._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\tQuantity :\t",0xc);
      KVar4 = DATA_TYPE::Supplies::GetQuantity(this_00);
      std::ostream::_M_insert<double>((double)(float)KVar4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p != &local_220.field_2) {
        operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != &local_200.field_2) {
        operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
      }
      this_00 = this_00 + 1;
    } while (this_00 != pSVar1);
  }
  pKVar2 = local_1e0;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return pKVar2;
}

Assistant:

KString Resupply_Offer_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Resupply Offer-\n"
       << IndentString( Logistics_Header::GetAsString(), 1 )
       << "\tNumber Of Supply Types: " << (KUINT16)m_ui8NumSupplyTypes;

    // Now add supplies
    vector<Supplies>::const_iterator citr = m_vSupplies.begin();
    vector<Supplies>::const_iterator citrEnd = m_vSupplies.end();

    // Add supplies to the stream
    for( ; citr != citrEnd; ++citr )
    {
        ss << IndentString( citr->GetAsString(), 1 )
           << "\tQuantity :	" << citr->GetQuantity();
    }

    return ss.str();
}